

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O3

void ngrams_raw_free(ngram_raw_t **raw_ngrams,uint32 *counts,int order)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  if (1 < order) {
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      if (counts[uVar4 + 1] != 0) {
        lVar3 = 0;
        uVar2 = 0;
        do {
          ckd_free(*(void **)((long)&raw_ngrams[uVar4]->words + lVar3));
          uVar2 = uVar2 + 1;
          lVar3 = lVar3 + 0x18;
        } while (uVar2 < counts[uVar1]);
      }
      ckd_free(raw_ngrams[uVar4]);
      uVar4 = uVar1;
    } while (uVar1 != order - 1);
  }
  ckd_free(raw_ngrams);
  return;
}

Assistant:

void
ngrams_raw_free(ngram_raw_t ** raw_ngrams, uint32 * counts, int order)
{
    uint32 num;
    int order_it;

    for (order_it = 0; order_it < order - 1; order_it++) {
        for (num = 0; num < counts[order_it + 1]; num++) {
            ckd_free(raw_ngrams[order_it][num].words);
        }
        ckd_free(raw_ngrams[order_it]);
    }
    ckd_free(raw_ngrams);
}